

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_encode_decode.hpp
# Opt level: O0

string * code_utils::url_encode(string *value)

{
  bool bVar1;
  reference pcVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  string *in_RDI;
  char *chr;
  const_iterator __end1;
  const_iterator __begin1;
  string *__range1;
  string *result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  string *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  size_type in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  undefined1 local_11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_11 = 0;
  this = in_RDI;
  local_10 = in_RSI;
  std::__cxx11::string::string(in_stack_ffffffffffffff60);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size(local_10);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_20 = local_10;
  local_28._M_current =
       (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               begin(in_stack_ffffffffffffff48);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end(this);
  while (bVar1 = __gnu_cxx::
                 operator==<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_RDI,
                            (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)in_stack_ffffffffffffff48), ((bVar1 ^ 0xffU) & 1) != 0) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_28);
    if (((((*pcVar2 < '0') || ('9' < *pcVar2)) && ((*pcVar2 < 'A' || ('Z' < *pcVar2)))) &&
        ((((*pcVar2 < 'a' || ('z' < *pcVar2)) && (*pcVar2 != '-')) &&
         ((*pcVar2 != '.' && (*pcVar2 != '_')))))) && (*pcVar2 != '~')) {
      in_stack_ffffffffffffff48 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &stack0xffffffffffffff67;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      std::operator+(this,(char)((ulong)in_RDI >> 0x38));
      std::operator+(this,(char)((ulong)in_RDI >> 0x38));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_RDI,in_stack_ffffffffffffff48);
      std::__cxx11::string::~string(in_RDI);
      std::__cxx11::string::~string(in_RDI);
      std::__cxx11::string::~string(in_RDI);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff67);
    }
    else {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                (in_RDI,(char)((ulong)in_stack_ffffffffffffff48 >> 0x38));
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_28);
  }
  return in_RDI;
}

Assistant:

inline static std::string url_encode(const std::string &value) noexcept {
  static auto hex_chars = "0123456789ABCDEF";

  std::string result;
  result.reserve(value.size());  // Minimum size of result

  for (auto &chr : value) {
    if (!((chr >= '0' && chr <= '9') || (chr >= 'A' && chr <= 'Z') ||
          (chr >= 'a' && chr <= 'z') || chr == '-' || chr == '.' ||
          chr == '_' || chr == '~'))
      result += std::string("%") +
                hex_chars[static_cast<unsigned char>(chr) >> 4] +
                hex_chars[static_cast<unsigned char>(chr) & 15];
    else
      result += chr;
  }

  return result;
}